

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_wait_release.h
# Opt level: O0

bool __kmp_wait_template<kmp_flag_64,0,true,false>
               (kmp_info_t *this_thr,kmp_flag_64 *flag,void *itt_sync_obj)

{
  bool bVar1;
  __int_type _Var2;
  long lVar3;
  kmp_flag_native<unsigned_long_long> *in_RSI;
  long in_RDI;
  atomic<int> *unfinished_threads;
  kmp_task_team_t *task_team_1;
  kmp_team_t *team_3;
  ompt_state_t ompt_exit_state;
  kmp_team_t *team_2;
  kmp_task_team_t *task_team;
  ompt_lw_taskteam_t *team_1;
  ompt_data_t *tId;
  ompt_state_t ompt_entry_state;
  kmp_team_t *team;
  int sync_iters;
  kmp_uint64 hibernate_goal;
  kmp_uint64 poll_count;
  int oversubscribed;
  int tasks_completed;
  int th_gtid;
  kmp_uint32 spins;
  void *spin;
  kmp_basic_flag_native<unsigned_long_long> *in_stack_ffffffffffffff20;
  __atomic_base<int> *in_stack_ffffffffffffff28;
  long in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  kmp_flag_64 *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff50;
  long local_98;
  int local_6c;
  long local_68;
  kmp_uint32 local_4c;
  unsigned_long_long *local_48;
  bool local_21;
  
  local_48 = kmp_flag_native<unsigned_long_long>::get(in_RSI);
  local_6c = 0;
  if ((__kmp_itt_fsync_prepare_ptr__3_0 != (undefined1 *)0x0) &&
     (local_48 == (unsigned_long_long *)0x0)) {
    local_48 = (unsigned_long_long *)0x0;
  }
  bVar1 = kmp_basic_flag_native<unsigned_long_long>::done_check(in_stack_ffffffffffffff20);
  if (bVar1) {
    if ((__kmp_itt_prepare_delay < 1) && (__kmp_itt_fsync_acquired_ptr__3_0 != (undefined1 *)0x0)) {
      (*(code *)__kmp_itt_fsync_acquired_ptr__3_0)(local_48);
    }
    local_21 = false;
  }
  else if ((*(long *)(in_RDI + 0x40) == 0) ||
          (_Var2 = std::__atomic_base::operator_cast_to_int(in_stack_ffffffffffffff28), _Var2 != 1))
  {
    local_4c = __kmp_yield_init;
    if ((__kmp_dflt_blocktime != 0x7fffffff) || (__kmp_pause_status == kmp_soft_paused)) {
      if (__kmp_pause_status == kmp_soft_paused) {
        local_68 = __kmp_hardware_timestamp();
      }
      else {
        lVar3 = __kmp_hardware_timestamp();
        local_68 = lVar3 + *(long *)(in_RDI + 0x88);
      }
    }
    while (bVar1 = kmp_basic_flag_native<unsigned_long_long>::notdone_check
                             (in_stack_ffffffffffffff20), bVar1) {
      local_98 = 0;
      if (__kmp_tasking_mode != tskm_immediate_exec) {
        local_98 = *(long *)(in_RDI + 0x1a8);
        if (local_98 == 0) {
          *(undefined4 *)(in_RDI + 0x1d0) = 1;
        }
        else if (*(int *)(local_98 + 0xc0) == 0) {
          *(undefined8 *)(in_RDI + 0x1a8) = 0;
          *(undefined4 *)(in_RDI + 0x1d0) = 1;
        }
        else if (*(int *)(local_98 + 0x50) == 1) {
          kmp_flag_64::execute_tasks
                    (in_stack_ffffffffffffff40,
                     (kmp_info_t *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                     (kmp_int32)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                     (int)in_stack_ffffffffffffff30,&in_stack_ffffffffffffff28->_M_i,
                     in_stack_ffffffffffffff20,(kmp_int32)in_stack_ffffffffffffff50);
        }
        else {
          *(undefined4 *)(in_RDI + 0x1d0) = 1;
        }
      }
      if ((((__kmp_itt_fsync_prepare_ptr__3_0 != (undefined1 *)0x0) &&
           (local_6c < __kmp_itt_prepare_delay)) &&
          (local_6c = local_6c + 1, __kmp_itt_prepare_delay <= local_6c)) &&
         (__kmp_itt_fsync_prepare_ptr__3_0 != (undefined1 *)0x0)) {
        (*(code *)__kmp_itt_fsync_prepare_ptr__3_0)(local_48);
      }
      if (__kmp_global.g.g_done != 0) {
        if (__kmp_global.g.g_abort != 0) {
          __kmp_abort_thread();
        }
        break;
      }
      __kmp_x86_pause();
      if ((__kmp_use_yield == 1) || (__kmp_use_yield == 2)) {
        in_stack_ffffffffffffff38 = __kmp_xproc;
        if (__kmp_avail_proc != 0) {
          in_stack_ffffffffffffff38 = __kmp_avail_proc;
        }
        in_stack_ffffffffffffff3c = __kmp_nth;
        if (__kmp_nth <= in_stack_ffffffffffffff38) goto LAB_001776ea;
        __kmp_yield();
      }
      else {
LAB_001776ea:
        if ((__kmp_use_yield == 1) && (local_4c = local_4c - 2, local_4c == 0)) {
          __kmp_yield();
          local_4c = __kmp_yield_next;
        }
      }
      if ((*(long *)(in_RDI + 0x40) != 0) &&
         (_Var2 = std::__atomic_base::operator_cast_to_int(in_stack_ffffffffffffff28), _Var2 == 1))
      break;
      if (((__kmp_dflt_blocktime != 0x7fffffff) || (__kmp_pause_status == kmp_soft_paused)) &&
         ((local_98 == 0 || (*(int *)(local_98 + 0x50) == 0)))) {
        in_stack_ffffffffffffff30 = local_68;
        __kmp_hardware_timestamp();
      }
    }
    if (((((ulong)ompt_enabled & 1) != 0) && (*(int *)(in_RDI + 0x160) != 0x102)) &&
       (*(int *)(in_RDI + 0x160) == 0x100)) {
      *(undefined4 *)(in_RDI + 0x160) = 0x101;
    }
    if ((__kmp_itt_prepare_delay <= local_6c) &&
       (__kmp_itt_fsync_acquired_ptr__3_0 != (undefined1 *)0x0)) {
      (*(code *)__kmp_itt_fsync_acquired_ptr__3_0)(local_48);
    }
    if ((*(long *)(in_RDI + 0x40) == 0) ||
       (_Var2 = std::__atomic_base::operator_cast_to_int(in_stack_ffffffffffffff28), _Var2 != 1)) {
      local_21 = false;
    }
    else {
      local_21 = true;
    }
  }
  else {
    local_21 = true;
  }
  return local_21;
}

Assistant:

static inline bool
__kmp_wait_template(kmp_info_t *this_thr,
                    C *flag USE_ITT_BUILD_ARG(void *itt_sync_obj)) {
#if USE_ITT_BUILD && USE_ITT_NOTIFY
  volatile void *spin = flag->get();
#endif
  kmp_uint32 spins;
  int th_gtid;
  int tasks_completed = FALSE;
  int oversubscribed;
#if !KMP_USE_MONITOR
  kmp_uint64 poll_count;
  kmp_uint64 hibernate_goal;
#else
  kmp_uint32 hibernate;
#endif

  KMP_FSYNC_SPIN_INIT(spin, NULL);
  if (flag->done_check()) {
    KMP_FSYNC_SPIN_ACQUIRED(CCAST(void *, spin));
    return false;
  }
  th_gtid = this_thr->th.th_info.ds.ds_gtid;
  if (cancellable) {
    kmp_team_t *team = this_thr->th.th_team;
    if (team && team->t.t_cancel_request == cancel_parallel)
      return true;
  }
#if KMP_OS_UNIX
  if (final_spin)
    KMP_ATOMIC_ST_REL(&this_thr->th.th_blocking, true);
#endif
  KA_TRACE(20,
           ("__kmp_wait_sleep: T#%d waiting for flag(%p)\n", th_gtid, flag));
#if KMP_STATS_ENABLED
  stats_state_e thread_state = KMP_GET_THREAD_STATE();
#endif

/* OMPT Behavior:
THIS function is called from
  __kmp_barrier (2 times)  (implicit or explicit barrier in parallel regions)
            these have join / fork behavior

       In these cases, we don't change the state or trigger events in THIS
function.
       Events are triggered in the calling code (__kmp_barrier):

                state := ompt_state_overhead
            barrier-begin
            barrier-wait-begin
                state := ompt_state_wait_barrier
          call join-barrier-implementation (finally arrive here)
          {}
          call fork-barrier-implementation (finally arrive here)
          {}
                state := ompt_state_overhead
            barrier-wait-end
            barrier-end
                state := ompt_state_work_parallel


  __kmp_fork_barrier  (after thread creation, before executing implicit task)
          call fork-barrier-implementation (finally arrive here)
          {} // worker arrive here with state = ompt_state_idle


  __kmp_join_barrier  (implicit barrier at end of parallel region)
                state := ompt_state_barrier_implicit
            barrier-begin
            barrier-wait-begin
          call join-barrier-implementation (finally arrive here
final_spin=FALSE)
          {
          }
  __kmp_fork_barrier  (implicit barrier at end of parallel region)
          call fork-barrier-implementation (finally arrive here final_spin=TRUE)

       Worker after task-team is finished:
            barrier-wait-end
            barrier-end
            implicit-task-end
            idle-begin
                state := ompt_state_idle

       Before leaving, if state = ompt_state_idle
            idle-end
                state := ompt_state_overhead
*/
#if OMPT_SUPPORT
  ompt_state_t ompt_entry_state;
  ompt_data_t *tId;
  if (ompt_enabled.enabled) {
    ompt_entry_state = this_thr->th.ompt_thread_info.state;
    if (!final_spin || ompt_entry_state != ompt_state_wait_barrier_implicit ||
        KMP_MASTER_TID(this_thr->th.th_info.ds.ds_tid)) {
      ompt_lw_taskteam_t *team =
          this_thr->th.th_team->t.ompt_serialized_team_info;
      if (team) {
        tId = &(team->ompt_task_info.task_data);
      } else {
        tId = OMPT_CUR_TASK_DATA(this_thr);
      }
    } else {
      tId = &(this_thr->th.ompt_thread_info.task_data);
    }
    if (final_spin && (__kmp_tasking_mode == tskm_immediate_exec ||
                       this_thr->th.th_task_team == NULL)) {
      // implicit task is done. Either no taskqueue, or task-team finished
      __ompt_implicit_task_end(this_thr, ompt_entry_state, tId);
    }
  }
#endif

  KMP_INIT_YIELD(spins); // Setup for waiting

  if (__kmp_dflt_blocktime != KMP_MAX_BLOCKTIME ||
      __kmp_pause_status == kmp_soft_paused) {
#if KMP_USE_MONITOR
// The worker threads cannot rely on the team struct existing at this point.
// Use the bt values cached in the thread struct instead.
#ifdef KMP_ADJUST_BLOCKTIME
    if (__kmp_pause_status == kmp_soft_paused ||
        (__kmp_zero_bt && !this_thr->th.th_team_bt_set))
      // Force immediate suspend if not set by user and more threads than
      // available procs
      hibernate = 0;
    else
      hibernate = this_thr->th.th_team_bt_intervals;
#else
    hibernate = this_thr->th.th_team_bt_intervals;
#endif /* KMP_ADJUST_BLOCKTIME */

    /* If the blocktime is nonzero, we want to make sure that we spin wait for
       the entirety of the specified #intervals, plus up to one interval more.
       This increment make certain that this thread doesn't go to sleep too
       soon.  */
    if (hibernate != 0)
      hibernate++;

    // Add in the current time value.
    hibernate += TCR_4(__kmp_global.g.g_time.dt.t_value);
    KF_TRACE(20, ("__kmp_wait_sleep: T#%d now=%d, hibernate=%d, intervals=%d\n",
                  th_gtid, __kmp_global.g.g_time.dt.t_value, hibernate,
                  hibernate - __kmp_global.g.g_time.dt.t_value));
#else
    if (__kmp_pause_status == kmp_soft_paused) {
      // Force immediate suspend
      hibernate_goal = KMP_NOW();
    } else
      hibernate_goal = KMP_NOW() + this_thr->th.th_team_bt_intervals;
    poll_count = 0;
#endif // KMP_USE_MONITOR
  }

  oversubscribed = (TCR_4(__kmp_nth) > __kmp_avail_proc);
  KMP_MB();

  // Main wait spin loop
  while (flag->notdone_check()) {
    kmp_task_team_t *task_team = NULL;
    if (__kmp_tasking_mode != tskm_immediate_exec) {
      task_team = this_thr->th.th_task_team;
      /* If the thread's task team pointer is NULL, it means one of 3 things:
         1) A newly-created thread is first being released by
         __kmp_fork_barrier(), and its task team has not been set up yet.
         2) All tasks have been executed to completion.
         3) Tasking is off for this region.  This could be because we are in a
         serialized region (perhaps the outer one), or else tasking was manually
         disabled (KMP_TASKING=0).  */
      if (task_team != NULL) {
        if (TCR_SYNC_4(task_team->tt.tt_active)) {
          if (KMP_TASKING_ENABLED(task_team))
            flag->execute_tasks(
                this_thr, th_gtid, final_spin,
                &tasks_completed USE_ITT_BUILD_ARG(itt_sync_obj), 0);
          else
            this_thr->th.th_reap_state = KMP_SAFE_TO_REAP;
        } else {
          KMP_DEBUG_ASSERT(!KMP_MASTER_TID(this_thr->th.th_info.ds.ds_tid));
#if OMPT_SUPPORT
          // task-team is done now, other cases should be catched above
          if (final_spin && ompt_enabled.enabled)
            __ompt_implicit_task_end(this_thr, ompt_entry_state, tId);
#endif
          this_thr->th.th_task_team = NULL;
          this_thr->th.th_reap_state = KMP_SAFE_TO_REAP;
        }
      } else {
        this_thr->th.th_reap_state = KMP_SAFE_TO_REAP;
      } // if
    } // if

    KMP_FSYNC_SPIN_PREPARE(CCAST(void *, spin));
    if (TCR_4(__kmp_global.g.g_done)) {
      if (__kmp_global.g.g_abort)
        __kmp_abort_thread();
      break;
    }

    // If we are oversubscribed, or have waited a bit (and
    // KMP_LIBRARY=throughput), then yield
    KMP_YIELD_OVERSUB_ELSE_SPIN(spins);

#if KMP_STATS_ENABLED
    // Check if thread has been signalled to idle state
    // This indicates that the logical "join-barrier" has finished
    if (this_thr->th.th_stats->isIdle() &&
        KMP_GET_THREAD_STATE() == FORK_JOIN_BARRIER) {
      KMP_SET_THREAD_STATE(IDLE);
      KMP_PUSH_PARTITIONED_TIMER(OMP_idle);
    }
#endif
    // Check if the barrier surrounding this wait loop has been cancelled
    if (cancellable) {
      kmp_team_t *team = this_thr->th.th_team;
      if (team && team->t.t_cancel_request == cancel_parallel)
        break;
    }

    // Don't suspend if KMP_BLOCKTIME is set to "infinite"
    if (__kmp_dflt_blocktime == KMP_MAX_BLOCKTIME &&
        __kmp_pause_status != kmp_soft_paused)
      continue;

    // Don't suspend if there is a likelihood of new tasks being spawned.
    if ((task_team != NULL) && TCR_4(task_team->tt.tt_found_tasks))
      continue;

#if KMP_USE_MONITOR
    // If we have waited a bit more, fall asleep
    if (TCR_4(__kmp_global.g.g_time.dt.t_value) < hibernate)
      continue;
#else
    if (KMP_BLOCKING(hibernate_goal, poll_count++))
      continue;
#endif
    // Don't suspend if wait loop designated non-sleepable
    // in template parameters
    if (!sleepable)
      continue;

    if (__kmp_dflt_blocktime == KMP_MAX_BLOCKTIME &&
        __kmp_pause_status != kmp_soft_paused)
      continue;

    KF_TRACE(50, ("__kmp_wait_sleep: T#%d suspend time reached\n", th_gtid));

#if KMP_OS_UNIX
    if (final_spin)
      KMP_ATOMIC_ST_REL(&this_thr->th.th_blocking, false);
#endif
    flag->suspend(th_gtid);
#if KMP_OS_UNIX
    if (final_spin)
      KMP_ATOMIC_ST_REL(&this_thr->th.th_blocking, true);
#endif

    if (TCR_4(__kmp_global.g.g_done)) {
      if (__kmp_global.g.g_abort)
        __kmp_abort_thread();
      break;
    } else if (__kmp_tasking_mode != tskm_immediate_exec &&
               this_thr->th.th_reap_state == KMP_SAFE_TO_REAP) {
      this_thr->th.th_reap_state = KMP_NOT_SAFE_TO_REAP;
    }
    // TODO: If thread is done with work and times out, disband/free
  }

#if OMPT_SUPPORT
  ompt_state_t ompt_exit_state = this_thr->th.ompt_thread_info.state;
  if (ompt_enabled.enabled && ompt_exit_state != ompt_state_undefined) {
#if OMPT_OPTIONAL
    if (final_spin) {
      __ompt_implicit_task_end(this_thr, ompt_exit_state, tId);
      ompt_exit_state = this_thr->th.ompt_thread_info.state;
    }
#endif
    if (ompt_exit_state == ompt_state_idle) {
      this_thr->th.ompt_thread_info.state = ompt_state_overhead;
    }
  }
#endif
#if KMP_STATS_ENABLED
  // If we were put into idle state, pop that off the state stack
  if (KMP_GET_THREAD_STATE() == IDLE) {
    KMP_POP_PARTITIONED_TIMER();
    KMP_SET_THREAD_STATE(thread_state);
    this_thr->th.th_stats->resetIdleFlag();
  }
#endif

#if KMP_OS_UNIX
  if (final_spin)
    KMP_ATOMIC_ST_REL(&this_thr->th.th_blocking, false);
#endif
  KMP_FSYNC_SPIN_ACQUIRED(CCAST(void *, spin));
  if (cancellable) {
    kmp_team_t *team = this_thr->th.th_team;
    if (team && team->t.t_cancel_request == cancel_parallel) {
      if (tasks_completed) {
        // undo the previous decrement of unfinished_threads so that the
        // thread can decrement at the join barrier with no problem
        kmp_task_team_t *task_team = this_thr->th.th_task_team;
        std::atomic<kmp_int32> *unfinished_threads =
            &(task_team->tt.tt_unfinished_threads);
        KMP_ATOMIC_INC(unfinished_threads);
      }
      return true;
    }
  }
  return false;
}